

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerProtocol.cxx
# Opt level: O3

void __thiscall
cmServerRequest::cmServerRequest
          (cmServerRequest *this,cmServer *server,cmConnection *connection,string *t,string *c,
          Value *d)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  paVar1 = &(this->Type).field_2;
  (this->Type)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (t->_M_dataplus)._M_p;
  paVar2 = &t->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&t->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->Type).field_2 + 8) = uVar4;
  }
  else {
    (this->Type)._M_dataplus._M_p = pcVar3;
    (this->Type).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->Type)._M_string_length = t->_M_string_length;
  (t->_M_dataplus)._M_p = (pointer)paVar2;
  t->_M_string_length = 0;
  (t->field_2)._M_local_buf[0] = '\0';
  paVar1 = &(this->Cookie).field_2;
  (this->Cookie)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (c->_M_dataplus)._M_p;
  paVar2 = &c->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&c->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->Cookie).field_2 + 8) = uVar4;
  }
  else {
    (this->Cookie)._M_dataplus._M_p = pcVar3;
    (this->Cookie).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->Cookie)._M_string_length = c->_M_string_length;
  (c->_M_dataplus)._M_p = (pointer)paVar2;
  c->_M_string_length = 0;
  (c->field_2)._M_local_buf[0] = '\0';
  Json::Value::Value(&this->Data,d);
  this->Connection = connection;
  this->m_Server = server;
  return;
}

Assistant:

cmServerRequest::cmServerRequest(cmServer* server, cmConnection* connection,
                                 std::string t, std::string c, Json::Value d)
  : Type(std::move(t))
  , Cookie(std::move(c))
  , Data(std::move(d))
  , Connection(connection)
  , m_Server(server)
{
}